

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

void clausifyMode(Problem *problem,bool theory)

{
  initializer_list<Kernel::TermList> args;
  initializer_list<Kernel::TermList> args_00;
  initializer_list<Kernel::Literal_*> lits;
  bool bVar1;
  UnitInputType UVar2;
  undefined8 *puVar3;
  ulong uVar4;
  Problem *obj;
  Inference *pIVar5;
  Clause *pCVar6;
  ostream *poVar7;
  byte in_SIL;
  Unit *in_stack_00000098;
  Problem *in_stack_000000a0;
  Clause *c;
  uint p;
  FormulaUnit *fu;
  Formula *f;
  Clause *cl;
  bool printed_conjecture;
  ClauseIterator cit;
  ScopedPtr<Kernel::Problem> prb;
  CompositeISE simplifier;
  string *in_stack_000030e8;
  Options *in_stack_000030f0;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  Problem *in_stack_fffffffffffffd80;
  Problem *in_stack_fffffffffffffd90;
  CompositeISE *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  Clause *in_stack_fffffffffffffdb0;
  Inference *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  FormulaUnit *in_stack_fffffffffffffdd0;
  ostream *in_stack_fffffffffffffdd8;
  Unit *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  uint in_stack_fffffffffffffdec;
  Formula *in_stack_fffffffffffffdf0;
  string local_178 [32];
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffebc;
  Signature *in_stack_fffffffffffffec0;
  NonspecificInference0 local_132;
  Inference local_130;
  initializer_list<Kernel::TermList> local_100;
  initializer_list<Kernel::TermList> local_f0;
  Literal *local_e0;
  Literal *local_d8;
  Literal **local_d0;
  undefined8 local_c8;
  Clause *local_c0;
  uint local_b4;
  string local_b0 [32];
  string local_90 [32];
  Unit *local_70;
  Formula *local_68;
  Clause *local_60;
  byte local_51;
  ScopedPtr<Kernel::Problem> local_48 [7];
  byte local_9;
  
  local_9 = in_SIL & 1;
  Inferences::CompositeISE::CompositeISE((CompositeISE *)in_stack_fffffffffffffd80);
  puVar3 = (undefined8 *)operator_new(0x10);
  *puVar3 = 0;
  puVar3[1] = 0;
  Inferences::TrivialInequalitiesRemovalISE::TrivialInequalitiesRemovalISE
            ((TrivialInequalitiesRemovalISE *)in_stack_fffffffffffffd80);
  Inferences::CompositeISE::addFront
            ((CompositeISE *)in_stack_fffffffffffffd80,
             (ImmediateSimplificationEngine *)
             CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  operator_new(0x18);
  Inferences::TautologyDeletionISE::TautologyDeletionISE
            ((TautologyDeletionISE *)in_stack_fffffffffffffd80,(bool)in_stack_fffffffffffffd7f);
  Inferences::CompositeISE::addFront
            ((CompositeISE *)in_stack_fffffffffffffd80,
             (ImmediateSimplificationEngine *)
             CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  puVar3 = (undefined8 *)operator_new(0x10);
  *puVar3 = 0;
  puVar3[1] = 0;
  Inferences::DuplicateLiteralRemovalISE::DuplicateLiteralRemovalISE
            ((DuplicateLiteralRemovalISE *)in_stack_fffffffffffffd80);
  Inferences::CompositeISE::addFront
            ((CompositeISE *)in_stack_fffffffffffffd80,
             (ImmediateSimplificationEngine *)
             CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  Shell::Options::strategySamplerFilename_abi_cxx11_(Lib::env);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    Shell::Options::strategySamplerFilename_abi_cxx11_(Lib::env);
    Shell::Options::sampleStrategy(in_stack_000030f0,in_stack_000030e8);
  }
  obj = preprocessProblem(in_stack_fffffffffffffd90);
  Lib::ScopedPtr<Kernel::Problem>::ScopedPtr(local_48,obj);
  Shell::UIHelper::outputSymbolDeclarations((ostream *)in_stack_fffffffffffffd90);
  Lib::ScopedPtr<Kernel::Problem>::operator->(local_48);
  Kernel::Problem::clauseIterator
            ((Problem *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  local_51 = 0;
  while (bVar1 = Lib::VirtualIterator<Kernel::Clause_*>::hasNext
                           ((VirtualIterator<Kernel::Clause_*> *)0x18514b), bVar1) {
    local_60 = Lib::VirtualIterator<Kernel::Clause_*>::next
                         ((VirtualIterator<Kernel::Clause_*> *)0x185171);
    local_60 = Inferences::CompositeISE::simplify
                         (in_stack_fffffffffffffd98,(Clause *)in_stack_fffffffffffffd90);
    if (local_60 != (Clause *)0x0) {
      UVar2 = Kernel::Unit::inputType((Unit *)0x185209);
      bVar1 = true;
      if (UVar2 != CONJECTURE) {
        UVar2 = Kernel::Unit::inputType((Unit *)0x185234);
        bVar1 = UVar2 == NEGATED_CONJECTURE;
      }
      local_51 = (local_51 & 1) != 0 || bVar1;
      if ((local_9 & 1) == 0) {
        Shell::TPTPPrinter::toString_abi_cxx11_(in_stack_00000098);
        in_stack_fffffffffffffdd0 = (FormulaUnit *)std::operator<<((ostream *)&std::cout,local_b0);
        std::operator<<((ostream *)in_stack_fffffffffffffdd0,"\n");
        std::__cxx11::string::~string(local_b0);
      }
      else {
        local_68 = Kernel::Formula::fromClause(in_stack_fffffffffffffdb0);
        pIVar5 = Kernel::Unit::inference(&local_60->super_Unit);
        UVar2 = Kernel::Inference::inputType(pIVar5);
        if (UVar2 == CONJECTURE) {
          pIVar5 = Kernel::Unit::inference(&local_60->super_Unit);
          Kernel::Inference::setInputType(pIVar5,NEGATED_CONJECTURE);
        }
        in_stack_fffffffffffffde0 = (Unit *)Kernel::FormulaUnit::operator_new(0x18531d);
        in_stack_fffffffffffffdf0 = local_68;
        Kernel::Unit::inference(&local_60->super_Unit);
        Kernel::FormulaUnit::FormulaUnit
                  (in_stack_fffffffffffffdd0,
                   (Formula *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   in_stack_fffffffffffffdc0);
        local_70 = in_stack_fffffffffffffde0;
        in_stack_fffffffffffffdec = Kernel::Unit::number(&local_60->super_Unit);
        Kernel::Unit::overwriteNumber(in_stack_fffffffffffffde0,in_stack_fffffffffffffdec);
        Shell::TPTPPrinter::toString_abi_cxx11_(in_stack_00000098);
        in_stack_fffffffffffffdd8 = std::operator<<((ostream *)&std::cout,local_90);
        std::operator<<(in_stack_fffffffffffffdd8,"\n");
        std::__cxx11::string::~string(local_90);
      }
    }
  }
  if (((local_51 & 1) == 0) && (bVar1 = Shell::UIHelper::haveConjecture(), bVar1)) {
    local_b4 = Kernel::Signature::addFreshPredicate
                         (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                          in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::initializer_list<Kernel::TermList>::initializer_list(&local_f0);
    args._M_len = (size_type)in_stack_fffffffffffffde0;
    args._M_array = (iterator)in_stack_fffffffffffffdd8;
    local_e0 = Kernel::Literal::create
                         ((uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                          SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x18,0),args);
    std::initializer_list<Kernel::TermList>::initializer_list(&local_100);
    args_00._M_len = (size_type)in_stack_fffffffffffffde0;
    args_00._M_array = (iterator)in_stack_fffffffffffffdd8;
    local_d8 = Kernel::Literal::create
                         ((uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                          SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x18,0),args_00);
    local_d0 = &local_e0;
    local_c8 = 2;
    Kernel::NonspecificInference0::NonspecificInference0(&local_132,NEGATED_CONJECTURE,INPUT);
    Kernel::Inference::Inference
              ((Inference *)in_stack_fffffffffffffd80,
               (NonspecificInference0 *)
               CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    lits._M_array._4_4_ = in_stack_fffffffffffffdec;
    lits._M_array._0_4_ = in_stack_fffffffffffffde8;
    lits._M_len = (size_type)in_stack_fffffffffffffdf0;
    pCVar6 = Kernel::Clause::fromLiterals(lits,(Inference *)in_stack_fffffffffffffde0);
    Kernel::Inference::~Inference(&local_130);
    local_c0 = pCVar6;
    Shell::TPTPPrinter::toString_abi_cxx11_(in_stack_00000098);
    poVar7 = std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffea8);
    std::operator<<(poVar7,"\n");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
  }
  Shell::Options::latexOutput_abi_cxx11_
            ((Options *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd80,
                          (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  std::__cxx11::string::~string(local_178);
  if (bVar1) {
    in_stack_fffffffffffffd80 = Lib::ScopedPtr<Kernel::Problem>::ptr(local_48);
    outputClausesToLaTeX(in_stack_000000a0);
  }
  vampireReturnValue = 0;
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
            ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffffd80);
  Lib::ScopedPtr<Kernel::Problem>::~ScopedPtr
            ((ScopedPtr<Kernel::Problem> *)in_stack_fffffffffffffd80);
  Inferences::CompositeISE::~CompositeISE((CompositeISE *)in_stack_fffffffffffffd80);
  return;
}

Assistant:

void clausifyMode(Problem* problem, bool theory)
{
  CompositeISE simplifier;
  simplifier.addFront(new TrivialInequalitiesRemovalISE());
  simplifier.addFront(new TautologyDeletionISE());
  simplifier.addFront(new DuplicateLiteralRemovalISE());

  if (!env.options->strategySamplerFilename().empty()) {
    env.options->sampleStrategy(env.options->strategySamplerFilename());
  }

  ScopedPtr<Problem> prb(preprocessProblem(problem));

  //outputSymbolDeclarations deals with sorts as well for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);

  ClauseIterator cit = prb->clauseIterator();
  bool printed_conjecture = false;
  while (cit.hasNext()) {
    Clause* cl = cit.next();
    cl = simplifier.simplify(cl);
    if (!cl) {
      continue;
    }
    printed_conjecture |= cl->inputType() == UnitInputType::CONJECTURE || cl->inputType() == UnitInputType::NEGATED_CONJECTURE;
    if (theory) {
      Formula* f = Formula::fromClause(cl);

      // CONJECTURE as inputType is evil, as it cannot occur multiple times
      if (cl->inference().inputType() == UnitInputType::CONJECTURE) {
        cl->inference().setInputType(UnitInputType::NEGATED_CONJECTURE);
      }

      FormulaUnit* fu = new FormulaUnit(f,cl->inference()); // we are stealing cl's inference, which is not nice!
      fu->overwriteNumber(cl->number()); // we are also making sure it's number is the same as that of the original (for Kostya from Russia to CASC, with love, and back again)
      std::cout << TPTPPrinter::toString(fu) << "\n";
    } else {
      std::cout << TPTPPrinter::toString(cl) << "\n";
    }
  }
  if(!printed_conjecture && UIHelper::haveConjecture()){
    unsigned p = env.signature->addFreshPredicate(0,"p");
    auto c = Clause::fromLiterals({
        Literal::create(p, /* polarity */ true , {}),
        Literal::create(p, /* polarity */ false, {})
      }, 
      NonspecificInference0(UnitInputType::NEGATED_CONJECTURE,InferenceRule::INPUT));
    std::cout << TPTPPrinter::toString(c) << "\n";
  }

  if (env.options->latexOutput() != "off") { outputClausesToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}